

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O0

void __thiscall HighsOptions::HighsOptions(HighsOptions *this)

{
  undefined8 *in_RDI;
  HighsOptionsStruct *in_stack_000000b0;
  HighsOptions *in_stack_00003a70;
  
  HighsOptionsStruct::HighsOptionsStruct(in_stack_000000b0);
  *in_RDI = &PTR__HighsOptions_001b6508;
  CLI::std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::vector
            ((vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)0x127787);
  initRecords(in_stack_00003a70);
  ::HighsOptions::setLogOptions();
  return;
}

Assistant:

HighsOptions() {
    initRecords();
    setLogOptions();
  }